

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# red_black_tree.cpp
# Opt level: O0

void eastl::RBTreeErase(rbtree_node_base *pNode,rbtree_node_base *pNodeAnchor)

{
  this_type **pptVar1;
  this_type **pptVar2;
  rbtree_node_base *prVar3;
  rbtree_node_base *prVar4;
  bool bVar5;
  rbtree_node_base *local_58;
  rbtree_node_base *pNodeTemp_1;
  rbtree_node_base *pNodeTemp;
  rbtree_node_base *pNodeChildParent;
  rbtree_node_base *pNodeChild;
  rbtree_node_base *pNodeSuccessor;
  rbtree_node_base **pNodeRightmostRef;
  rbtree_node_base **pNodeLeftmostRef;
  rbtree_node_base **pNodeRootRef;
  rbtree_node_base *pNodeAnchor_local;
  rbtree_node_base *pNode_local;
  
  pptVar1 = &pNodeAnchor->mpNodeParent;
  pptVar2 = &pNodeAnchor->mpNodeLeft;
  pNodeChild = pNode;
  if (pNode->mpNodeLeft == (this_type *)0x0) {
    pNodeChildParent = pNode->mpNodeRight;
  }
  else if (pNode->mpNodeRight == (this_type *)0x0) {
    pNodeChildParent = pNode->mpNodeLeft;
  }
  else {
    for (pNodeChild = pNode->mpNodeRight; pNodeChild->mpNodeLeft != (this_type *)0x0;
        pNodeChild = pNodeChild->mpNodeLeft) {
    }
    pNodeChildParent = pNodeChild->mpNodeRight;
  }
  if (pNodeChild == pNode) {
    pNodeTemp = pNodeChild->mpNodeParent;
    if (pNodeChildParent != (rbtree_node_base *)0x0) {
      pNodeChildParent->mpNodeParent = pNodeChild->mpNodeParent;
    }
    if (pNode == *pptVar1) {
      *pptVar1 = pNodeChildParent;
    }
    else if (pNode == pNode->mpNodeParent->mpNodeLeft) {
      pNode->mpNodeParent->mpNodeLeft = pNodeChildParent;
    }
    else {
      pNode->mpNodeParent->mpNodeRight = pNodeChildParent;
    }
    if (pNode == *pptVar2) {
      if (pNode->mpNodeRight == (this_type *)0x0) {
        *pptVar2 = pNode->mpNodeParent;
      }
      else {
        prVar3 = RBTreeGetMinChild(pNodeChildParent);
        *pptVar2 = prVar3;
      }
    }
    if (pNode == pNodeAnchor->mpNodeRight) {
      if (pNode->mpNodeLeft == (this_type *)0x0) {
        pNodeAnchor->mpNodeRight = pNode->mpNodeParent;
      }
      else {
        prVar3 = RBTreeGetMaxChild(pNodeChildParent);
        pNodeAnchor->mpNodeRight = prVar3;
      }
    }
  }
  else {
    pNode->mpNodeLeft->mpNodeParent = pNodeChild;
    pNodeChild->mpNodeLeft = pNode->mpNodeLeft;
    if (pNodeChild == pNode->mpNodeRight) {
      pNodeTemp = pNodeChild;
    }
    else {
      pNodeTemp = pNodeChild->mpNodeParent;
      if (pNodeChildParent != (rbtree_node_base *)0x0) {
        pNodeChildParent->mpNodeParent = pNodeTemp;
      }
      pNodeTemp->mpNodeLeft = pNodeChildParent;
      pNodeChild->mpNodeRight = pNode->mpNodeRight;
      pNode->mpNodeRight->mpNodeParent = pNodeChild;
    }
    if (pNode == *pptVar1) {
      *pptVar1 = pNodeChild;
    }
    else if (pNode == pNode->mpNodeParent->mpNodeLeft) {
      pNode->mpNodeParent->mpNodeLeft = pNodeChild;
    }
    else {
      pNode->mpNodeParent->mpNodeRight = pNodeChild;
    }
    pNodeChild->mpNodeParent = pNode->mpNodeParent;
    swap<char>(&pNodeChild->mColor,&pNode->mColor);
  }
  if (pNode->mColor != '\x01') {
    return;
  }
  do {
    prVar3 = pNodeTemp;
    bVar5 = false;
    if ((pNodeChildParent != *pptVar1) &&
       (bVar5 = true, pNodeChildParent != (rbtree_node_base *)0x0)) {
      bVar5 = pNodeChildParent->mColor == '\x01';
    }
    if (!bVar5) goto LAB_00112583;
    if (pNodeChildParent == pNodeTemp->mpNodeLeft) {
      pNodeTemp_1 = pNodeTemp->mpNodeRight;
      if (pNodeTemp_1->mColor == '\0') {
        pNodeTemp_1->mColor = '\x01';
        pNodeTemp->mColor = '\0';
        prVar4 = RBTreeRotateLeft(pNodeTemp,*pptVar1);
        *pptVar1 = prVar4;
        pNodeTemp_1 = pNodeTemp->mpNodeRight;
      }
      if (((pNodeTemp_1->mpNodeLeft != (this_type *)0x0) &&
          (pNodeTemp_1->mpNodeLeft->mColor != '\x01')) ||
         ((pNodeTemp_1->mpNodeRight != (this_type *)0x0 &&
          (pNodeTemp_1->mpNodeRight->mColor != '\x01')))) {
        if ((pNodeTemp_1->mpNodeRight == (this_type *)0x0) ||
           (pNodeTemp_1->mpNodeRight->mColor == '\x01')) {
          pNodeTemp_1->mpNodeLeft->mColor = '\x01';
          pNodeTemp_1->mColor = '\0';
          prVar3 = RBTreeRotateRight(pNodeTemp_1,*pptVar1);
          *pptVar1 = prVar3;
          pNodeTemp_1 = pNodeTemp->mpNodeRight;
        }
        pNodeTemp_1->mColor = pNodeTemp->mColor;
        pNodeTemp->mColor = '\x01';
        if (pNodeTemp_1->mpNodeRight != (this_type *)0x0) {
          pNodeTemp_1->mpNodeRight->mColor = '\x01';
        }
        prVar3 = RBTreeRotateLeft(pNodeTemp,*pptVar1);
        *pptVar1 = prVar3;
LAB_00112583:
        if (pNodeChildParent == (rbtree_node_base *)0x0) {
          return;
        }
        pNodeChildParent->mColor = '\x01';
        return;
      }
      pNodeTemp_1->mColor = '\0';
      pNodeTemp = pNodeTemp->mpNodeParent;
    }
    else {
      local_58 = pNodeTemp->mpNodeLeft;
      if (local_58->mColor == '\0') {
        local_58->mColor = '\x01';
        pNodeTemp->mColor = '\0';
        prVar4 = RBTreeRotateRight(pNodeTemp,*pptVar1);
        *pptVar1 = prVar4;
        local_58 = pNodeTemp->mpNodeLeft;
      }
      if (((local_58->mpNodeRight != (this_type *)0x0) && (local_58->mpNodeRight->mColor != '\x01'))
         || ((local_58->mpNodeLeft != (this_type *)0x0 && (local_58->mpNodeLeft->mColor != '\x01')))
         ) {
        if ((local_58->mpNodeLeft == (this_type *)0x0) || (local_58->mpNodeLeft->mColor == '\x01'))
        {
          local_58->mpNodeRight->mColor = '\x01';
          local_58->mColor = '\0';
          prVar3 = RBTreeRotateLeft(local_58,*pptVar1);
          *pptVar1 = prVar3;
          local_58 = pNodeTemp->mpNodeLeft;
        }
        local_58->mColor = pNodeTemp->mColor;
        pNodeTemp->mColor = '\x01';
        if (local_58->mpNodeLeft != (this_type *)0x0) {
          local_58->mpNodeLeft->mColor = '\x01';
        }
        prVar3 = RBTreeRotateRight(pNodeTemp,*pptVar1);
        *pptVar1 = prVar3;
        goto LAB_00112583;
      }
      local_58->mColor = '\0';
      pNodeTemp = pNodeTemp->mpNodeParent;
    }
    pNodeChildParent = prVar3;
  } while( true );
}

Assistant:

EASTL_API void RBTreeErase(rbtree_node_base* pNode, rbtree_node_base* pNodeAnchor)
    {
        rbtree_node_base*& pNodeRootRef      = pNodeAnchor->mpNodeParent;
        rbtree_node_base*& pNodeLeftmostRef  = pNodeAnchor->mpNodeLeft;
        rbtree_node_base*& pNodeRightmostRef = pNodeAnchor->mpNodeRight;
        rbtree_node_base*  pNodeSuccessor    = pNode;
        rbtree_node_base*  pNodeChild        = NULL;
        rbtree_node_base*  pNodeChildParent  = NULL;

        if(pNodeSuccessor->mpNodeLeft == NULL)         // pNode has at most one non-NULL child.
            pNodeChild = pNodeSuccessor->mpNodeRight;  // pNodeChild might be null.
        else if(pNodeSuccessor->mpNodeRight == NULL)   // pNode has exactly one non-NULL child.
            pNodeChild = pNodeSuccessor->mpNodeLeft;   // pNodeChild is not null.
        else 
        {
            // pNode has two non-null children. Set pNodeSuccessor to pNode's successor. pNodeChild might be NULL.
            pNodeSuccessor = pNodeSuccessor->mpNodeRight;

            while(pNodeSuccessor->mpNodeLeft)
                pNodeSuccessor = pNodeSuccessor->mpNodeLeft;

            pNodeChild = pNodeSuccessor->mpNodeRight;
        }

        // Here we remove pNode from the tree and fix up the node pointers appropriately around it.
        if(pNodeSuccessor == pNode) // If pNode was a leaf node (had both NULL children)...
        {
            pNodeChildParent = pNodeSuccessor->mpNodeParent;  // Assign pNodeReplacement's parent.

            if(pNodeChild) 
                pNodeChild->mpNodeParent = pNodeSuccessor->mpNodeParent;

            if(pNode == pNodeRootRef) // If the node being deleted is the root node...
                pNodeRootRef = pNodeChild; // Set the new root node to be the pNodeReplacement.
            else 
            {
                if(pNode == pNode->mpNodeParent->mpNodeLeft) // If pNode is a left node...
                    pNode->mpNodeParent->mpNodeLeft  = pNodeChild;  // Make pNode's replacement node be on the same side.
                else
                    pNode->mpNodeParent->mpNodeRight = pNodeChild;
                // Now pNode is disconnected from the bottom of the tree (recall that in this pathway pNode was determined to be a leaf).
            }

            if(pNode == pNodeLeftmostRef) // If pNode is the tree begin() node...
            {
                // Because pNode is the tree begin(), pNode->mpNodeLeft must be NULL.
                // Here we assign the new begin() (first node).
                if(pNode->mpNodeRight)
                    pNodeLeftmostRef = RBTreeGetMinChild(pNodeChild); 
                else
                    pNodeLeftmostRef = pNode->mpNodeParent; // This  makes (pNodeLeftmostRef == end()) if (pNode == root node)
            }

            if(pNode == pNodeRightmostRef) // If pNode is the tree last (rbegin()) node...
            {
                // Because pNode is the tree rbegin(), pNode->mpNodeRight must be NULL.
                // Here we assign the new rbegin() (last node)
                if(pNode->mpNodeLeft)
                    pNodeRightmostRef = RBTreeGetMaxChild(pNodeChild);
                else // pNodeChild == pNode->mpNodeLeft
                    pNodeRightmostRef = pNode->mpNodeParent; // makes pNodeRightmostRef == &mAnchor if pNode == pNodeRootRef
            }
        }
        else // else (pNodeSuccessor != pNode)
        {
            // Relink pNodeSuccessor in place of pNode. pNodeSuccessor is pNode's successor.
            // We specifically set pNodeSuccessor to be on the right child side of pNode, so fix up the left child side.
            pNode->mpNodeLeft->mpNodeParent = pNodeSuccessor; 
            pNodeSuccessor->mpNodeLeft = pNode->mpNodeLeft;

            if(pNodeSuccessor == pNode->mpNodeRight) // If pNode's successor was at the bottom of the tree... (yes that's effectively what this statement means)
                pNodeChildParent = pNodeSuccessor; // Assign pNodeReplacement's parent.
            else
            {
                pNodeChildParent = pNodeSuccessor->mpNodeParent;

                if(pNodeChild)
                    pNodeChild->mpNodeParent = pNodeChildParent;

                pNodeChildParent->mpNodeLeft = pNodeChild;

                pNodeSuccessor->mpNodeRight = pNode->mpNodeRight;
                pNode->mpNodeRight->mpNodeParent = pNodeSuccessor;
            }

            if(pNode == pNodeRootRef)
                pNodeRootRef = pNodeSuccessor;
            else if(pNode == pNode->mpNodeParent->mpNodeLeft)
                pNode->mpNodeParent->mpNodeLeft = pNodeSuccessor;
            else 
                pNode->mpNodeParent->mpNodeRight = pNodeSuccessor;

            // Now pNode is disconnected from the tree.

            pNodeSuccessor->mpNodeParent = pNode->mpNodeParent;
            eastl::swap(pNodeSuccessor->mColor, pNode->mColor);
        }

        // Here we do tree balancing as per the conventional red-black tree algorithm.
        if(pNode->mColor == kRBTreeColorBlack) 
        { 
            while((pNodeChild != pNodeRootRef) && ((pNodeChild == NULL) || (pNodeChild->mColor == kRBTreeColorBlack)))
            {
                if(pNodeChild == pNodeChildParent->mpNodeLeft) 
                {
                    rbtree_node_base* pNodeTemp = pNodeChildParent->mpNodeRight;

                    if(pNodeTemp->mColor == kRBTreeColorRed) 
                    {
                        pNodeTemp->mColor = kRBTreeColorBlack;
                        pNodeChildParent->mColor = kRBTreeColorRed;
                        pNodeRootRef = RBTreeRotateLeft(pNodeChildParent, pNodeRootRef);
                        pNodeTemp = pNodeChildParent->mpNodeRight;
                    }

                    if(((pNodeTemp->mpNodeLeft  == NULL) || (pNodeTemp->mpNodeLeft->mColor  == kRBTreeColorBlack)) &&
                        ((pNodeTemp->mpNodeRight == NULL) || (pNodeTemp->mpNodeRight->mColor == kRBTreeColorBlack))) 
                    {
                        pNodeTemp->mColor = kRBTreeColorRed;
                        pNodeChild = pNodeChildParent;
                        pNodeChildParent = pNodeChildParent->mpNodeParent;
                    } 
                    else 
                    {
                        if((pNodeTemp->mpNodeRight == NULL) || (pNodeTemp->mpNodeRight->mColor == kRBTreeColorBlack)) 
                        {
                            pNodeTemp->mpNodeLeft->mColor = kRBTreeColorBlack;
                            pNodeTemp->mColor = kRBTreeColorRed;
                            pNodeRootRef = RBTreeRotateRight(pNodeTemp, pNodeRootRef);
                            pNodeTemp = pNodeChildParent->mpNodeRight;
                        }

                        pNodeTemp->mColor = pNodeChildParent->mColor;
                        pNodeChildParent->mColor = kRBTreeColorBlack;

                        if(pNodeTemp->mpNodeRight) 
                            pNodeTemp->mpNodeRight->mColor = kRBTreeColorBlack;

                        pNodeRootRef = RBTreeRotateLeft(pNodeChildParent, pNodeRootRef);
                        break;
                    }
                } 
                else 
                {   
                    // The following is the same as above, with mpNodeRight <-> mpNodeLeft.
                    rbtree_node_base* pNodeTemp = pNodeChildParent->mpNodeLeft;

                    if(pNodeTemp->mColor == kRBTreeColorRed) 
                    {
                        pNodeTemp->mColor        = kRBTreeColorBlack;
                        pNodeChildParent->mColor = kRBTreeColorRed;

                        pNodeRootRef = RBTreeRotateRight(pNodeChildParent, pNodeRootRef);
                        pNodeTemp = pNodeChildParent->mpNodeLeft;
                    }

                    if(((pNodeTemp->mpNodeRight == NULL) || (pNodeTemp->mpNodeRight->mColor == kRBTreeColorBlack)) &&
                        ((pNodeTemp->mpNodeLeft  == NULL) || (pNodeTemp->mpNodeLeft->mColor  == kRBTreeColorBlack))) 
                    {
                        pNodeTemp->mColor = kRBTreeColorRed;
                        pNodeChild       = pNodeChildParent;
                        pNodeChildParent = pNodeChildParent->mpNodeParent;
                    } 
                    else 
                    {
                        if((pNodeTemp->mpNodeLeft == NULL) || (pNodeTemp->mpNodeLeft->mColor == kRBTreeColorBlack)) 
                        {
                            pNodeTemp->mpNodeRight->mColor = kRBTreeColorBlack;
                            pNodeTemp->mColor              = kRBTreeColorRed;

                            pNodeRootRef = RBTreeRotateLeft(pNodeTemp, pNodeRootRef);
                            pNodeTemp = pNodeChildParent->mpNodeLeft;
                        }

                        pNodeTemp->mColor = pNodeChildParent->mColor;
                        pNodeChildParent->mColor = kRBTreeColorBlack;

                        if(pNodeTemp->mpNodeLeft) 
                            pNodeTemp->mpNodeLeft->mColor = kRBTreeColorBlack;

                        pNodeRootRef = RBTreeRotateRight(pNodeChildParent, pNodeRootRef);
                        break;
                    }
                }
            }

            if(pNodeChild)
                pNodeChild->mColor = kRBTreeColorBlack;
        }

    }